

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

QSize __thiscall QToolBoxButton::sizeHint(QToolBoxButton *this)

{
  byte bVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  int icone;
  QSize textSize;
  QSize iconSize;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar3;
  QAbstractButton *in_stack_ffffffffffffff38;
  QSize *s2;
  QSize *s1;
  int local_68;
  int local_64;
  QSize local_60;
  QSize local_58 [3];
  QFontMetrics local_40 [8];
  undefined8 local_38;
  QSize local_30;
  QIcon local_20;
  undefined1 *local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
  QAbstractButton::icon(in_stack_ffffffffffffff38);
  bVar1 = QIcon::isNull();
  QIcon::~QIcon(&local_20);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    pQVar2 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                           );
    QWidget::parentWidget((QWidget *)0x7027c3);
    (**(code **)(*(long *)pQVar2 + 0xe0))(pQVar2,0x3e,0);
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    QSize::operator+=((QSize *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (QSize *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  local_30 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  s1 = local_58;
  QAbstractButton::text(in_stack_ffffffffffffff38);
  uVar3 = 0;
  local_38 = QFontMetrics::size((int)local_40,(QString *)0x800,(int)s1,(int *)0x0);
  s2 = &local_60;
  QSize::QSize((QSize *)CONCAT44(uVar3,in_stack_ffffffffffffff30),in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff28);
  local_30 = ::operator+(s1,s2);
  QString::~QString((QString *)0x7028ad);
  QFontMetrics::~QFontMetrics(local_40);
  QSize::width((QSize *)0x7028c9);
  QSize::width((QSize *)0x7028df);
  local_64 = QSize::height((QSize *)0x7028f5);
  local_68 = QSize::height((QSize *)0x702903);
  qMax<int>(&local_64,&local_68);
  QSize::QSize((QSize *)CONCAT44(uVar3,in_stack_ffffffffffffff30),in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QToolBoxButton::sizeHint() const
{
    QSize iconSize(8, 8);
    if (!icon().isNull()) {
        int icone = style()->pixelMetric(QStyle::PM_SmallIconSize, nullptr, parentWidget() /* QToolBox */);
        iconSize += QSize(icone + 2, icone);
    }
    QSize textSize = fontMetrics().size(Qt::TextShowMnemonic, text()) + QSize(0, 8);

    return QSize(iconSize.width() + textSize.width(), qMax(iconSize.height(), textSize.height()));
}